

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O3

void freeDeepBuffers<Imath_3_2::half>
               (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                *channels)

{
  _List_node_base *p_Var1;
  void *pvVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  for (p_Var1 = (channels->
                super__List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)channels;
      p_Var1 = (((_List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    p_Var5 = p_Var1[1]._M_next;
    if (0 < (long)p_Var5) {
      p_Var3 = p_Var1[1]._M_prev;
      lVar8 = 0;
      lVar6 = 0;
      p_Var4 = p_Var3;
      do {
        if (0 < (long)p_Var4) {
          lVar7 = 0;
          do {
            pvVar2 = *(void **)(*(long *)(p_Var1 + 1 + 1) + lVar7 * 8 + (long)p_Var4 * lVar8);
            if (pvVar2 != (void *)0x0) {
              operator_delete__(pvVar2);
              p_Var3 = p_Var1[1]._M_prev;
            }
            lVar7 = lVar7 + 1;
            p_Var4 = p_Var3;
          } while (lVar7 < (long)p_Var3);
          p_Var5 = p_Var1[1]._M_next;
        }
        lVar6 = lVar6 + 1;
        lVar8 = lVar8 + 8;
      } while (lVar6 < (long)p_Var5);
    }
  }
  return;
}

Assistant:

void
freeDeepBuffers (list<Array2D<T*>>& channels)
{
    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;
        for (int y = 0; y < channel.height (); y++)
            for (int x = 0; x < channel.width (); x++)
                delete[] channel[y][x];
    }
}